

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::setDomainChangeStack
          (HighsDomain *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack)

{
  double dVar1;
  pointer pHVar2;
  pointer piVar3;
  pointer piVar4;
  pointer ppVar5;
  pointer pRVar6;
  pointer pHVar7;
  HighsBoundType *pHVar8;
  pointer pHVar9;
  pointer piVar10;
  uint uVar11;
  uint uVar12;
  HighsDomainChange boundchg;
  
  this->infeasible_ = false;
  pHVar7 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar2 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar7 != pHVar2) {
    piVar3 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar9 = pHVar7;
    do {
      piVar10 = piVar4;
      if (pHVar9->boundtype == kLower) {
        piVar10 = piVar3;
      }
      piVar10[pHVar9->column] = -1;
      pHVar9 = pHVar9 + 1;
    } while (pHVar9 != pHVar2);
  }
  ppVar5 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar5) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar5;
  }
  if (pHVar7 != pHVar2) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar7;
  }
  pRVar6 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar6) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar6;
  }
  piVar3 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar3;
  }
  pHVar7 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar12 = (uint)((ulong)((long)(domchgstack->
                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar7) >> 4);
  if (uVar12 == 0) {
    return;
  }
  uVar11 = 0;
LAB_002958da:
  pHVar8 = &pHVar7[uVar11].boundtype;
  do {
    uVar11 = uVar11 + 1;
    dVar1 = ((HighsDomainChange *)(pHVar8 + -3))->boundval;
    if (*pHVar8 == kUpper) {
      if (dVar1 < (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)pHVar8[-1]]) break;
    }
    else if ((*pHVar8 != kLower) ||
            ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[(int)pHVar8[-1]] < dVar1)) break;
    pHVar8 = pHVar8 + 4;
    if (uVar11 == uVar12) {
      return;
    }
  } while( true );
  boundchg._8_8_ = *(undefined8 *)(pHVar8 + -1);
  boundchg.boundval = dVar1;
  changeBound(this,boundchg,(Reason)0xfffffffe);
  if (this->infeasible_ != false) {
    return;
  }
  if (uVar11 == uVar12) {
    return;
  }
  pHVar7 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
           _M_impl.super__Vector_impl_data._M_start;
  goto LAB_002958da;
}

Assistant:

void HighsDomain::setDomainChangeStack(
    const std::vector<HighsDomainChange>& domchgstack) {
  infeasible_ = false;
  mipsolver->mipdata_->debugSolution.resetDomain(*this);

  if (!domchgstack_.empty()) {
    for (const HighsDomainChange& domchg : domchgstack_) {
      if (domchg.boundtype == HighsBoundType::kLower)
        colLowerPos_[domchg.column] = -1;
      else
        colUpperPos_[domchg.column] = -1;
    }
  }

  prevboundval_.clear();
  domchgstack_.clear();
  domchgreason_.clear();
  branchPos_.clear();
  HighsInt stacksize = domchgstack.size();
  for (HighsInt k = 0; k != stacksize; ++k) {
    if (domchgstack[k].boundtype == HighsBoundType::kLower &&
        domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
      continue;
    if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
        domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
      continue;

    changeBound(domchgstack[k], Reason::unspecified());

    if (infeasible_) break;
  }
}